

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_minVecScalar_ivec2(ShaderEvalContext *c)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = (uint)c->in[1].m_data[0];
  uVar2 = (uint)c->in[0].m_data[3];
  uVar3 = (uint)c->in[0].m_data[1];
  uVar4 = -(uint)((int)uVar2 < (int)uVar1);
  uVar5 = -(uint)((int)uVar3 < (int)uVar1);
  *(ulong *)((c->color).m_data + 1) =
       CONCAT44((float)(int)(~uVar5 & uVar1 | uVar3 & uVar5),
                (float)(int)(~uVar4 & uVar1 | uVar2 & uVar4));
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }